

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufBackToBuffer(xmlBufPtr buf,xmlBufferPtr ret)

{
  xmlBufferPtr ret_local;
  xmlBufPtr buf_local;
  
  if ((buf == (xmlBufPtr)0x0) || (ret == (xmlBufferPtr)0x0)) {
    buf_local._4_4_ = -1;
  }
  else if (((buf->flags & 3) == 0) && (((buf->flags & 4) == 0 && (buf->use < 0x7fffffff)))) {
    ret->use = (uint)buf->use;
    if (buf->size < 0x7fffffff) {
      ret->size = (int)buf->size + 1;
    }
    else {
      ret->size = 0x7fffffff;
    }
    ret->alloc = XML_BUFFER_ALLOC_IO;
    ret->content = buf->content;
    ret->contentIO = buf->mem;
    (*xmlFree)(buf);
    buf_local._4_4_ = 0;
  }
  else {
    xmlBufFree(buf);
    ret->content = (xmlChar *)0x0;
    ret->contentIO = (xmlChar *)0x0;
    ret->use = 0;
    ret->size = 0;
    buf_local._4_4_ = -1;
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufBackToBuffer(xmlBufPtr buf, xmlBufferPtr ret) {
    if ((buf == NULL) || (ret == NULL))
        return(-1);

    if ((BUF_ERROR(buf)) || (BUF_STATIC(buf)) ||
        (buf->use >= INT_MAX)) {
        xmlBufFree(buf);
        ret->content = NULL;
        ret->contentIO = NULL;
        ret->use = 0;
        ret->size = 0;
        return(-1);
    }

    ret->use = buf->use;
    if (buf->size >= INT_MAX) {
        /* Keep the buffer but provide a truncated size value. */
        ret->size = INT_MAX;
    } else {
        ret->size = buf->size + 1;
    }
    ret->alloc = XML_BUFFER_ALLOC_IO;
    ret->content = buf->content;
    ret->contentIO = buf->mem;
    xmlFree(buf);
    return(0);
}